

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,Header *aHeader,ByteArray *aBuf)

{
  byte bVar1;
  char cVar2;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_a8;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  bVar1 = *(byte *)aHeader;
  if (bVar1 < 0x90 && (bVar1 & 3) == 1) {
    local_88.types_[0] =
         CONCAT31(local_88.types_[0]._1_3_,bVar1 >> 4 | bVar1 * '\x04' & 0x30) | 0x40;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (aBuf,(uchar *)&local_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(aBuf,&aHeader->mCode);
    local_88.types_[0]._0_1_ = *(undefined1 *)((long)&aHeader->mMessageId + 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (aBuf,(uchar *)&local_88);
    local_88.types_[0]._0_1_ = (char)aHeader->mMessageId;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (aBuf,(uchar *)&local_88);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
               (const_iterator)
               (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,aHeader->mToken,
               aHeader->mToken + (*(byte *)aHeader >> 4));
  }
  else {
    local_88.types_[0] = none_type;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "serialize an invalid CoAP message header";
    local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x28;
    local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_88.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_88.parse_funcs_[0] = (parse_func)0x0;
    from = "serialize an invalid CoAP message header";
    write.handler_ = &local_88;
    local_88.context_.types_ = local_88.types_;
    while (from != "") {
      cVar2 = *from;
      to = from;
      while (cVar2 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_001c0afb;
        }
        cVar2 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_88);
    }
LAB_001c0afb:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,(v10 *)"serialize an invalid CoAP message header",
               (string_view)ZEXT816(0x28),args);
    local_50._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_a8);
    Error::operator=(__return_storage_ptr__,(Error *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(const Header &aHeader, ByteArray &aBuf) const
{
    Error error;

    VerifyOrExit(aHeader.IsValid(), error = ERROR_INVALID_ARGS("serialize an invalid CoAP message header"));

    aBuf.push_back((aHeader.mVersion << 6) | (aHeader.mType << 4) | aHeader.mTokenLength);
    aBuf.push_back(aHeader.mCode);
    aBuf.push_back((aHeader.mMessageId & 0xff00) >> 8);
    aBuf.push_back((aHeader.mMessageId & 0x00ff));
    aBuf.insert(aBuf.end(), aHeader.mToken, aHeader.mToken + aHeader.mTokenLength);

exit:
    return error;
}